

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O2

void __thiscall
ScriptElement_OpTypeConstructor_Test::~ScriptElement_OpTypeConstructor_Test
          (ScriptElement_OpTypeConstructor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptElement, OpTypeConstructor) {
  ScriptElement op_elem = ScriptElement(ScriptOperator::OP_CHECKSIG);

  EXPECT_EQ(ScriptElementType::kElementOpCode, op_elem.GetType());
  EXPECT_EQ(ScriptOperator::OP_CHECKSIG, op_elem.GetOpCode());
  EXPECT_EQ(ByteData().GetBytes(), op_elem.GetBinaryData().GetBytes());
  EXPECT_EQ(0, op_elem.GetNumber());
  EXPECT_EQ(ByteData("ac").GetBytes(), op_elem.GetData().GetBytes());
  EXPECT_STREQ("OP_CHECKSIG", op_elem.ToString().c_str());
  EXPECT_FALSE(op_elem.IsBinary());
  EXPECT_FALSE(op_elem.IsNumber());
  EXPECT_TRUE(op_elem.IsOpCode());
}